

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_clib_index(jit_State *J,RecordFFData *rd)

{
  void *ptr_00;
  RecordFFData *pRVar1;
  undefined2 uVar2;
  CTypeID CVar3;
  TRef TVar4;
  uint uVar5;
  cTValue *pcVar6;
  TRef local_11c;
  TRef ptr;
  void *sp;
  CTypeID sid;
  cTValue *tv;
  jit_State *pjStack_f8;
  CTypeID id;
  CType *ct;
  GCstr *name;
  CLibrary *cl;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  CType *ct_1;
  CLibrary *local_b8;
  undefined2 local_ae;
  undefined2 local_ac;
  undefined2 local_aa;
  RecordFFData *local_a8;
  jit_State *local_a0;
  CLibrary *local_98;
  CType *local_90;
  CLibrary *local_88;
  TValue local_80;
  TValue tv_1;
  RecordFFData *local_70;
  uint local_64;
  CLibrary *local_60;
  uint local_54;
  CLibrary *local_50;
  uint local_44;
  CLibrary *local_40;
  uint local_34;
  CLibrary *local_30;
  uint local_24;
  CLibrary *local_20;
  uint local_14;
  CLibrary *local_10;
  
  cl = *(CLibrary **)&J[-1].penalty[0x3c].val;
  if ((((*J->base & 0x1f000000) == 0xc000000) && ((J->base[1] & 0x1f000000) == 0x4000000)) &&
     (*(char *)((rd->argv->u64 & 0x7fffffffffff) + 10) == '\x02')) {
    name = (GCstr *)((rd->argv->u64 & 0x7fffffffffff) + 0x30);
    ct = (CType *)(rd->argv[1].u64 & 0x7fffffffffff);
    cts = (CTState *)rd;
    rd_local = (RecordFFData *)J;
    CVar3 = lj_ctype_getname((CTState *)cl,(CType **)&stack0xffffffffffffff08,(GCstr *)ct,0x1840);
    pcVar6 = lj_tab_getstr(*(GCtab **)&name->marked,(GCstr *)ct);
    pRVar1 = rd_local;
    uVar5 = *(uint *)&cts->L;
    cts->top = (int)(ulong)uVar5;
    cts->sizetab = (int)((ulong)uVar5 >> 0x20);
    if (((CVar3 == 0) || (pcVar6 == (cTValue *)0x0)) || (pcVar6->u64 == 0xffffffffffffffff)) {
      lj_trace_err((jit_State *)rd_local,LJ_TRERR_NOCACHE);
    }
    uVar2 = (undefined2)*(undefined4 *)(*(long *)&rd_local[6].data + 4);
    TVar4 = lj_ir_kgc((jit_State *)rd_local,(GCobj *)ct,IRT_STR);
    local_a8 = pRVar1;
    local_aa = 0x884;
    local_ae = (undefined2)TVar4;
    *(undefined2 *)&pRVar1[7].field_0x14 = 0x884;
    *(undefined2 *)&pRVar1[7].data = uVar2;
    *(undefined2 *)((long)&pRVar1[7].data + 2) = local_ae;
    local_ac = uVar2;
    lj_opt_fold((jit_State *)rd_local);
    if (((CType *)pjStack_f8)->info >> 0x1c == 0xb) {
      if (0x7fffffff < ((CType *)pjStack_f8)->size) {
        local_88 = cl;
        local_90 = (CType *)pjStack_f8;
        local_64 = ((CType *)pjStack_f8)->info & 0xffff;
        local_60 = cl;
        local_10 = cl;
        local_14 = local_64;
        if ((*(uint *)((long)cl->handle + (ulong)local_64 * 0x18) & 0x800000) != 0) {
          local_80.n = (lua_Number)((CType *)pjStack_f8)->size;
          local_70 = rd_local;
          tv_1.u64 = local_80.u64;
          TVar4 = lj_ir_knum_u64((jit_State *)rd_local,local_80.u64);
          **(TRef **)&rd_local[6].data = TVar4;
          return;
        }
      }
      TVar4 = lj_ir_kint((jit_State *)rd_local,((CType *)pjStack_f8)->size);
      **(TRef **)&rd_local[6].data = TVar4;
    }
    else if (((CType *)pjStack_f8)->info >> 0x1c == 0xc) {
      uVar5 = ((CType *)pjStack_f8)->info & 0xffff;
      ptr_00 = *(void **)((pcVar6->u64 & 0x7fffffffffff) + 0x10);
      local_b8 = cl;
      local_40 = cl;
      local_30 = cl;
      J_local = (jit_State *)((long)cl->handle + (ulong)uVar5 * 0x18);
      while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
        local_98 = cl;
        local_a0 = J_local;
        local_50 = cl;
        local_54 = (uint)(J_local->cur).nextgc.gcptr64 & 0xffff;
        local_20 = cl;
        J_local = (jit_State *)((long)cl->handle + (ulong)local_54 * 0x18);
        local_24 = local_54;
      }
      pjStack_f8 = J_local;
      ct_1._4_4_ = uVar5;
      local_44 = uVar5;
      local_34 = uVar5;
      if (ptr_00 == (void *)((ulong)ptr_00 & 0xffffffff)) {
        local_11c = lj_ir_kptr_((jit_State *)rd_local,IR_KPTR,ptr_00);
      }
      else {
        local_11c = lj_ir_kint64((jit_State *)rd_local,(uint64_t)ptr_00);
      }
      if (*(int *)&cts->L == 0) {
        *(undefined1 *)((long)&rd_local[7].nres + 5) = 1;
        crec_ct_tv((jit_State *)rd_local,(CType *)pjStack_f8,local_11c,
                   *(TRef *)(*(long *)&rd_local[6].data + 8),(cTValue *)&cts->tab->name);
      }
      else {
        TVar4 = crec_tv_ct((jit_State *)rd_local,(CType *)pjStack_f8,uVar5,local_11c);
        **(TRef **)&rd_local[6].data = TVar4;
      }
    }
    else {
      TVar4 = lj_ir_kgc((jit_State *)rd_local,(GCobj *)(pcVar6->u64 & 0x7fffffffffff),IRT_CDATA);
      **(TRef **)&rd_local[6].data = TVar4;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_clib_index(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  if (tref_isudata(J->base[0]) && tref_isstr(J->base[1]) &&
      udataV(&rd->argv[0])->udtype == UDTYPE_FFI_CLIB) {
    CLibrary *cl = (CLibrary *)uddata(udataV(&rd->argv[0]));
    GCstr *name = strV(&rd->argv[1]);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    cTValue *tv = lj_tab_getstr(cl->cache, name);
    rd->nres = rd->data;
    if (id && tv && !tvisnil(tv)) {
      /* Specialize to the symbol name and make the result a constant. */
      emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, name));
      if (ctype_isconstval(ct->info)) {
	if (ct->size >= 0x80000000u &&
	    (ctype_child(cts, ct)->info & CTF_UNSIGNED))
	  J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)ct->size);
	else
	  J->base[0] = lj_ir_kint(J, (int32_t)ct->size);
      } else if (ctype_isextern(ct->info)) {
	CTypeID sid = ctype_cid(ct->info);
	void *sp = *(void **)cdataptr(cdataV(tv));
	TRef ptr;
	ct = ctype_raw(cts, sid);
	if (LJ_64 && !checkptr32(sp))
	  ptr = lj_ir_kintp(J, (uintptr_t)sp);
	else
	  ptr = lj_ir_kptr(J, sp);
	if (rd->data) {
	  J->base[0] = crec_tv_ct(J, ct, sid, ptr);
	} else {
	  J->needsnap = 1;
	  crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
	}
      } else {
	J->base[0] = lj_ir_kgc(J, obj2gco(cdataV(tv)), IRT_CDATA);
      }
    } else {
      lj_trace_err(J, LJ_TRERR_NOCACHE);
    }
  }  /* else: interpreter will throw. */
}